

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_impl.hpp
# Opt level: O1

string * __thiscall
toml::to_string_abi_cxx11_(string *__return_storage_ptr__,toml *this,integer_format c)

{
  ostringstream oss;
  byte local_189;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  if ((byte)this < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,
               &DAT_003f6d80 + *(int *)(&DAT_003f6d80 + ((ulong)this & 0xff) * 4),3);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"unknown integer_format: ",0x18);
    local_189 = (byte)this;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,(char *)&local_189,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string to_string(const integer_format c)
{
    std::ostringstream oss;
    oss << c;
    return oss.str();
}